

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsValue.c
# Opt level: O1

uint JsToUint32(JsValue *val)

{
  uint uVar1;
  double dVar2;
  JsValue local_28;
  
  JsToNumber(val,&local_28);
  uVar1 = 0;
  if ((val->type == JS_NUMBER) && (local_28.u.number != 0.0)) {
    dVar2 = fmod(local_28.u.number,4294967296.0);
    uVar1 = (uint)(long)(double)(~-(ulong)(dVar2 < 0.0) & (ulong)dVar2 |
                                (ulong)(dVar2 + 4294967296.0) & -(ulong)(dVar2 < 0.0));
  }
  return uVar1;
}

Assistant:

unsigned int JsToUint32(struct JsValue *val){
	
	struct JsValue i;
	JsToInteger(val, &i);
	if (val->type != JS_NUMBER || isnan(i.u.number) || i.u.number == 0.0)
		return 0;
	else {
		i.u.number = fmod(i.u.number ,4294967296.0); /* 2^32 */
		if (i.u.number < 0)
			i.u.number += 4294967296;
		return (unsigned int)i.u.number;
	}

}